

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

void __thiscall
Messages::Person_PhoneNumber::_internal_set_type(Person_PhoneNumber *this,Person_PhoneType value)

{
  if (value < (Person_PhoneType_WORK|Person_PhoneType_HOME)) {
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
    this->type_ = value;
    return;
  }
  __assert_fail("::Messages::Person_PhoneType_IsValid(value)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O2/proto/messages.pb.h"
                ,0x339,
                "void Messages::Person_PhoneNumber::_internal_set_type(::Messages::Person_PhoneType)"
               );
}

Assistant:

bool Person_PhoneType_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}